

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O0

shared_ptr<cali::ConfigSetImpl> __thiscall
cali::RuntimeConfig::RuntimeConfigImpl::init_configset
          (RuntimeConfigImpl *this,char *name,config_entry_list_t *list)

{
  bool bVar1;
  pointer ppVar2;
  ConfigSetImpl *this_00;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<cali::ConfigSetImpl> sVar4;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
  local_b0;
  const_iterator local_80;
  undefined1 local_71;
  _Self local_70 [3];
  allocator<char> local_51;
  key_type local_50;
  _Self local_30;
  iterator it;
  config_entry_list_t *list_local;
  char *name_local;
  RuntimeConfigImpl *this_local;
  shared_ptr<cali::ConfigSetImpl> *ret;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
                   *)(name + 0x68));
  if (bVar1) {
    init_config_database((RuntimeConfigImpl *)name);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)list,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
               *)(name + 0x68),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
              *)(name + 0x68));
  bVar1 = std::operator!=(&local_30,local_70);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>
             ::operator->(&local_30);
    std::shared_ptr<cali::ConfigSetImpl>::shared_ptr
              ((shared_ptr<cali::ConfigSetImpl> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    local_71 = 0;
    this_00 = (ConfigSetImpl *)operator_new(0x38);
    ConfigSetImpl::ConfigSetImpl(this_00);
    std::shared_ptr<cali::ConfigSetImpl>::shared_ptr<cali::ConfigSetImpl,void>
              ((shared_ptr<cali::ConfigSetImpl> *)this,this_00);
    this_01 = std::
              __shared_ptr_access<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    ConfigSetImpl::init(this_01,(EVP_PKEY_CTX *)list);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>
    ::_Rb_tree_const_iterator(&local_80,&local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,(char *)list,&local_d1);
    std::make_pair<std::__cxx11::string,std::shared_ptr<cali::ConfigSetImpl>&>
              (&local_b0,&local_d0,(shared_ptr<cali::ConfigSetImpl> *)this);
    std::
    map<std::__cxx11::string,std::shared_ptr<cali::ConfigSetImpl>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>>
    ::insert<std::pair<std::__cxx11::string,std::shared_ptr<cali::ConfigSetImpl>>>
              ((map<std::__cxx11::string,std::shared_ptr<cali::ConfigSetImpl>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>>
                *)(name + 0x68),local_80,&local_b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
    ::~pair(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cali::ConfigSetImpl>)
         sVar4.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ConfigSetImpl> init_configset(const char* name, const config_entry_list_t& list)
    {
        if (m_database.empty())
            init_config_database();

        auto it = m_database.find(name);

        if (it != m_database.end())
            return it->second;

        std::shared_ptr<ConfigSetImpl> ret { new ConfigSetImpl };

        ret->init(name, list, m_allow_read_env, m_combined_profile, m_top_profile);
        m_database.insert(it, make_pair(std::string(name), ret));

        return ret;
    }